

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

DescriptiveFramework * __thiscall
ASDCP::MXF::DescriptiveFramework::InitFromTLVSet(DescriptiveFramework *this,TLVReader *TLVSet)

{
  bool has_value;
  int iVar1;
  MDDEntry *Object;
  MDDEntry *in_RDX;
  TLVReader local_a0;
  undefined1 local_21;
  MDDEntry *local_20;
  TLVReader *TLVSet_local;
  DescriptiveFramework *this_local;
  Result_t *result;
  
  TLVSet_local = TLVSet;
  this_local = this;
  if (TLVSet[1].super_MemIOReader.m_p == (byte_t *)0x0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                  ,0xbe1,
                  "virtual ASDCP::Result_t ASDCP::MXF::DescriptiveFramework::InitFromTLVSet(TLVReader &)"
                 );
  }
  local_21 = 0;
  local_20 = in_RDX;
  InterchangeObject::InitFromTLVSet(&this->super_InterchangeObject,TLVSet);
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar1) {
    Object = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_DescriptiveFramework_LinkedDescriptiveFrameworkPlugInId);
    optional_property<Kumu::UUID>::get((optional_property<Kumu::UUID> *)&TLVSet[2].m_ElementMap);
    TLVReader::ReadObject(&local_a0,local_20,(IArchive *)Object);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_a0);
    Kumu::Result_t::~Result_t((Result_t *)&local_a0);
    has_value = Kumu::Result_t::operator==((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    optional_property<Kumu::UUID>::set_has_value
              ((optional_property<Kumu::UUID> *)&TLVSet[2].m_ElementMap,has_value);
  }
  return this;
}

Assistant:

ASDCP::Result_t
DescriptiveFramework::InitFromTLVSet(TLVReader& TLVSet)
{
  assert(m_Dict);
  Result_t result = InterchangeObject::InitFromTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) {
    result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(DescriptiveFramework, LinkedDescriptiveFrameworkPlugInId));
    LinkedDescriptiveFrameworkPlugInId.set_has_value( result == RESULT_OK );
  }
  return result;
}